

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O1

DdNode * extraZddUnateInfoCompute(DdManager *dd,DdNode *bFunc,DdNode *bVars)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *P;
  DdNode *P_00;
  DdNode *pDVar7;
  DdNode *pDVar8;
  bool bVar9;
  
  pDVar7 = (DdNode *)((ulong)bFunc & 0xfffffffffffffffe);
  if (pDVar7->index == 0x7fffffff) {
    if (bVars->index != 0x7fffffff) {
      pDVar7 = extraZddGetSingletonsBoth(dd,bVars);
      return pDVar7;
    }
    return dd->zero;
  }
  if (dd->one == bVars) {
    __assert_fail("bVars != b1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddUnate.c"
                  ,399,"DdNode *extraZddUnateInfoCompute(DdManager *, DdNode *, DdNode *)");
  }
  pDVar5 = cuddCacheLookup2Zdd(dd,extraZddUnateInfoCompute,bFunc,bVars);
  if (pDVar5 != (DdNode *)0x0) {
    return pDVar5;
  }
  piVar3 = dd->perm;
  iVar1 = piVar3[pDVar7->index];
  uVar2 = bVars->index;
  iVar4 = piVar3[uVar2];
  pDVar5 = bVars;
  while (iVar4 < iVar1) {
    pDVar5 = (pDVar5->type).kids.T;
    uVar2 = pDVar5->index;
    iVar4 = piVar3[uVar2];
  }
  if (pDVar7->index != uVar2) {
    __assert_fail("bFR->index == bVarsNew->index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddUnate.c"
                  ,0x1a5,"DdNode *extraZddUnateInfoCompute(DdManager *, DdNode *, DdNode *)");
  }
  pDVar8 = (pDVar7->type).kids.E;
  if (pDVar7 == bFunc) {
    pDVar6 = (pDVar7->type).kids.T;
  }
  else {
    pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
    pDVar6 = (DdNode *)((ulong)(pDVar7->type).kids.T ^ 1);
  }
  P = extraZddUnateInfoCompute(dd,pDVar8,(pDVar5->type).kids.T);
  if (P == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar3 = (int *)(((ulong)P & 0xfffffffffffffffe) + 4);
  *piVar3 = *piVar3 + 1;
  P_00 = P;
  if (P != dd->zero) {
    pDVar5 = extraZddUnateInfoCompute(dd,pDVar6,(pDVar5->type).kids.T);
    if (pDVar5 == (DdNode *)0x0) goto LAB_0081b9a4;
    piVar3 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar3 = *piVar3 + 1;
    P_00 = cuddZddIntersect(dd,P,pDVar5);
    if (P_00 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,P);
      P = pDVar5;
      goto LAB_0081b9a4;
    }
    piVar3 = (int *)(((ulong)P_00 & 0xfffffffffffffffe) + 4);
    *piVar3 = *piVar3 + 1;
    Cudd_RecursiveDerefZdd(dd,P);
    Cudd_RecursiveDerefZdd(dd,pDVar5);
  }
  iVar4 = Cudd_bddLeq(dd,pDVar8,pDVar6);
  if (iVar4 == 0) {
    iVar4 = Cudd_bddLeq(dd,pDVar6,pDVar8);
    bVar9 = iVar4 != 0;
    iVar4 = (uint)bVar9 * 2 + -1;
  }
  else {
    iVar4 = 0;
    bVar9 = true;
  }
  P = P_00;
  pDVar5 = bVars;
  if (bVar9) {
    pDVar7 = cuddZddGetNode(dd,iVar4 + pDVar7->index * 2,dd->one,dd->zero);
    if (pDVar7 == (DdNode *)0x0) goto LAB_0081b9a4;
    piVar3 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
    *piVar3 = *piVar3 + 1;
    P = cuddZddUnion(dd,P_00,pDVar7);
    if (P == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,P_00);
      P = pDVar7;
      goto LAB_0081b9a4;
    }
    piVar3 = (int *)(((ulong)P & 0xfffffffffffffffe) + 4);
    *piVar3 = *piVar3 + 1;
    Cudd_RecursiveDerefZdd(dd,P_00);
    Cudd_RecursiveDerefZdd(dd,pDVar7);
  }
  while( true ) {
    if (iVar1 <= dd->perm[pDVar5->index]) {
      piVar3 = (int *)(((ulong)P & 0xfffffffffffffffe) + 4);
      *piVar3 = *piVar3 + -1;
      cuddCacheInsert2(dd,extraZddUnateInfoCompute,bFunc,bVars,P);
      return P;
    }
    pDVar7 = cuddZddGetNode(dd,pDVar5->index * 2 + 1,dd->one,dd->zero);
    if (pDVar7 == (DdNode *)0x0) goto LAB_0081b9a4;
    piVar3 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
    *piVar3 = *piVar3 + 1;
    pDVar8 = cuddZddUnion(dd,P,pDVar7);
    if (pDVar8 == (DdNode *)0x0) break;
    piVar3 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
    *piVar3 = *piVar3 + 1;
    Cudd_RecursiveDerefZdd(dd,P);
    Cudd_RecursiveDerefZdd(dd,pDVar7);
    pDVar7 = cuddZddGetNode(dd,pDVar5->index * 2,dd->one,dd->zero);
    P = pDVar8;
    if (pDVar7 == (DdNode *)0x0) goto LAB_0081b9a4;
    piVar3 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
    *piVar3 = *piVar3 + 1;
    pDVar6 = cuddZddUnion(dd,pDVar8,pDVar7);
    if (pDVar6 == (DdNode *)0x0) break;
    piVar3 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
    *piVar3 = *piVar3 + 1;
    Cudd_RecursiveDerefZdd(dd,pDVar8);
    Cudd_RecursiveDerefZdd(dd,pDVar7);
    P = pDVar6;
    pDVar5 = (pDVar5->type).kids.T;
  }
  Cudd_RecursiveDerefZdd(dd,P);
  P = pDVar7;
LAB_0081b9a4:
  Cudd_RecursiveDerefZdd(dd,P);
  return (DdNode *)0x0;
}

Assistant:

DdNode * 
extraZddUnateInfoCompute( 
  DdManager * dd,   /* the manager */
  DdNode * bFunc,   /* the function whose symmetries are computed */
  DdNode * bVars )  /* the set of variables on which this function depends */
{
    DdNode * zRes;
    DdNode * bFR = Cudd_Regular(bFunc); 

    if ( cuddIsConstant(bFR) )
    {
        if ( cuddIsConstant(bVars) )
            return z0;
        return extraZddGetSingletonsBoth( dd, bVars );
    }
    assert( bVars != b1 );

    if ( (zRes = cuddCacheLookup2Zdd(dd, extraZddUnateInfoCompute, bFunc, bVars)) )
        return zRes;
    else
    {
        DdNode * zRes0, * zRes1;
        DdNode * zTemp, * zPlus;             
        DdNode * bF0, * bF1;             
        DdNode * bVarsNew;
        int nVarsExtra;
        int LevelF;
        int AddVar;

        // every variable in bF should be also in bVars, therefore LevelF cannot be above LevelV
        // if LevelF is below LevelV, scroll through the vars in bVars to the same level as F
        // count how many extra vars are there in bVars
        nVarsExtra = 0;
        LevelF = dd->perm[bFR->index];
        for ( bVarsNew = bVars; LevelF > dd->perm[bVarsNew->index]; bVarsNew = cuddT(bVarsNew) )
            nVarsExtra++; 
        // the indexes (level) of variables should be synchronized now
        assert( bFR->index == bVarsNew->index );

        // cofactor the function
        if ( bFR != bFunc ) // bFunc is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }

        // solve subproblems
        zRes0 = extraZddUnateInfoCompute( dd, bF0, cuddT(bVarsNew) );
        if ( zRes0 == NULL )
            return NULL;
        cuddRef( zRes0 );

        // if there is no symmetries in the negative cofactor
        // there is no need to test the positive cofactor
        if ( zRes0 == z0 )
            zRes = zRes0;  // zRes takes reference
        else
        {
            zRes1 = extraZddUnateInfoCompute( dd, bF1, cuddT(bVarsNew) );
            if ( zRes1 == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                return NULL;
            }
            cuddRef( zRes1 );

            // only those variables are pair-wise symmetric 
            // that are pair-wise symmetric in both cofactors
            // therefore, intersect the solutions
            zRes = cuddZddIntersect( dd, zRes0, zRes1 );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                Cudd_RecursiveDerefZdd( dd, zRes1 );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zRes0 );
            Cudd_RecursiveDerefZdd( dd, zRes1 );
        }

        // consider the current top-most variable
        AddVar = -1;
        if ( Cudd_bddLeq( dd, bF0, bF1 ) ) // pos
            AddVar = 0;
        else if ( Cudd_bddLeq( dd, bF1, bF0 ) ) // neg
            AddVar = 1;
        if ( AddVar >= 0 )
        {
            // create the singleton
            zPlus = cuddZddGetNode( dd, 2*bFR->index + AddVar, z1, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );

            // add these to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }
        // only zRes is referenced at this point

        // if we skipped some variables, these variables cannot be symmetric with
        // any variables that are currently in the support of bF, but they can be 
        // symmetric with the variables that are in bVars but not in the support of bF
        for ( bVarsNew = bVars; LevelF > dd->perm[bVarsNew->index]; bVarsNew = cuddT(bVarsNew) )
        {
            // create the negative singleton
            zPlus = cuddZddGetNode( dd, 2*bVarsNew->index+1, z1, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );

            // add these to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        

            // create the positive singleton
            zPlus = cuddZddGetNode( dd, 2*bVarsNew->index, z1, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );

            // add these to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }
        cuddDeref( zRes );

        /* insert the result into cache */
        cuddCacheInsert2(dd, extraZddUnateInfoCompute, bFunc, bVars, zRes);
        return zRes;
    }
}